

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall QPDF::removePage(QPDF *this,QPDFObjectHandle *page)

{
  int at;
  int iVar1;
  size_type sVar2;
  pointer pMVar3;
  pointer pMVar4;
  size_t __n;
  reference obj;
  int local_134;
  int local_11c;
  QPDFObjGen QStack_118;
  int i;
  QPDFObjectHandle *local_110;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_108;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_100;
  const_iterator local_f8;
  QPDFObjectHandle local_f0;
  allocator<char> local_d9;
  string local_d8;
  int local_b8;
  allocator<char> local_b1;
  int npages;
  undefined1 local_90 [8];
  QPDFObjectHandle kids;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [24];
  QPDFObjectHandle pages;
  int pos;
  QPDFObjectHandle *page_local;
  QPDF *this_local;
  
  at = findPage(this,page);
  if (at == 0) {
    local_134 = 0;
  }
  else {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      (&pMVar3->all_pages);
    pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar2 - 1);
    iVar1 = toI<unsigned_long>((unsigned_long *)
                               &pages.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
    local_134 = 2;
    if (at == iVar1) {
      local_134 = 1;
    }
  }
  QTC::TC("qpdf","QPDF remove page",local_134);
  getRoot((QPDF *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Pages",&local_69);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_48 + 0x10),(string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&npages,"/Kids",&local_b1);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_90,(string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)&npages);
  std::allocator<char>::~allocator(&local_b1);
  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_90,at);
  local_b8 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/Count",&local_d9);
  QPDFObjectHandle::newInteger(&local_f0,(long)local_b8);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)(local_48 + 0x10),&local_d8,&local_f0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_108._M_current =
       (QPDFObjectHandle *)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(&pMVar4->all_pages);
  local_100 = __gnu_cxx::
              __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
              ::operator+(&local_108,(long)at);
  __gnu_cxx::
  __normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
  ::__normal_iterator<QPDFObjectHandle*>
            ((__normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
              *)&local_f8,&local_100);
  local_110 = (QPDFObjectHandle *)
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::erase
                        (&pMVar3->all_pages,local_f8);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  QStack_118 = QPDFObjectHandle::getObjGen(page);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  erase(&pMVar3->pageobj_to_pages_pos,&stack0xfffffffffffffee8);
  for (local_11c = at; local_11c < local_b8; local_11c = local_11c + 1) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    __n = toS<int>(&local_11c);
    obj = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                    (&pMVar3->all_pages,__n);
    insertPageobjToPage(this,obj,local_11c,false);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_48 + 0x10));
  return;
}

Assistant:

void
QPDF::removePage(QPDFObjectHandle page)
{
    int pos = findPage(page); // also ensures flat /Pages
    QTC::TC(
        "qpdf",
        "QPDF remove page",
        (pos == 0) ? 0 :                                // remove at beginning
            (pos == toI(m->all_pages.size() - 1)) ? 1   // end
                                                  : 2); // remove in middle

    QPDFObjectHandle pages = getRoot().getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");

    kids.eraseItem(pos);
    int npages = kids.getArrayNItems();
    pages.replaceKey("/Count", QPDFObjectHandle::newInteger(npages));
    m->all_pages.erase(m->all_pages.begin() + pos);
    m->pageobj_to_pages_pos.erase(page.getObjGen());
    for (int i = pos; i < npages; ++i) {
        insertPageobjToPage(m->all_pages.at(toS(i)), i, false);
    }
}